

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall CRegexStack::CRegexStack(CRegexStack *this)

{
  char *pcVar1;
  
  this->bufsiz_ = 0x2000;
  pcVar1 = (char *)malloc(0x2000);
  this->buf_ = pcVar1;
  this->sp_ = -1;
  this->used_ = 0;
  return;
}

Assistant:

CRegexStack()
    {
        /* allocate the initial state buffer */
        bufsiz_ = 8192;
        buf_ = (char *)t3malloc(bufsiz_);

        /* we don't have anything on the stack yet */
        sp_ = -1;
        used_ = 0;
    }